

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writefile_test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  string str;
  string sId;
  string sStack_10060;
  WriteFile write;
  
  std::__cxx11::string::string((string *)&sStack_10060,"./temp.log",(allocator *)&str);
  WriteFile::WriteFile(&write,&sStack_10060);
  std::__cxx11::string::~string((string *)&sStack_10060);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  for (iVar1 = -0x1a; iVar1 != 0; iVar1 = iVar1 + 1) {
    std::__cxx11::string::push_back((char)&str);
  }
  for (iVar1 = 0; iVar1 != 10000; iVar1 = iVar1 + 1) {
    std::__cxx11::to_string(&sId,iVar1);
    WriteFile::Append(&write,sId._M_dataplus._M_p,sId._M_string_length);
    WriteFile::Append(&write," : ",3);
    WriteFile::Append(&write,str._M_dataplus._M_p,str._M_string_length);
    WriteFile::Append(&write,"\n",1);
    std::__cxx11::string::~string((string *)&sId);
  }
  WriteFile::Sync(&write);
  std::__cxx11::string::~string((string *)&str);
  WriteFile::~WriteFile(&write);
  return 0;
}

Assistant:

int main()
{
	WriteFile write("./temp.log");
	
	string str;
	for (int i = 0; i < 26; ++i)
	{
		str.push_back('a' + i);
	}
	
	for (int i = 0; i < 10000; ++i)
	{
		string sId = to_string(i);
		write.Append(sId.c_str(), sId.size());
		write.Append(" : ", 3);
		write.Append(str.c_str(), str.size());
		write.Append("\n", 1);
	}
	
	write.Sync();
}